

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O0

_Bool test_fprob(int K,int nTest)

{
  float loss_00;
  float fVar1;
  uint uVar2;
  uint in_ESI;
  uint in_EDI;
  double dVar3;
  int nfail;
  float expected_fp;
  float loss;
  int i;
  int nLosses;
  float expected_fps [3];
  float losses [3];
  _Bool success;
  int local_2c;
  float local_24 [6];
  byte local_9;
  uint local_8;
  uint local_4;
  
  local_9 = 1;
  local_24[3] = 0.1;
  local_24[4] = 0.85;
  local_24[5] = 1.0;
  local_24[0] = -1.0;
  local_24[1] = -1.0;
  local_24[2] = -1.0;
  local_8 = in_ESI;
  local_4 = in_EDI;
  if (in_EDI == 100) {
    dVar3 = pow(10.0,-2.4);
    local_24[0] = (float)dVar3;
    dVar3 = pow(10.0,-2.3);
    local_24[1] = (float)dVar3;
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    loss_00 = local_24[(long)local_2c + 3];
    fVar1 = local_24[local_2c];
    printf("Running fixed loss tests. K=%d, nTest=%d, loss=%g.\n",(double)loss_00,(ulong)local_4,
           (ulong)local_8);
    uVar2 = zero_overhead_test(local_4,local_8,loss_00);
    if ((int)uVar2 < 0) {
      fprintf(_stderr,"Error:  random_esi_test() failed.\n");
      local_9 = 0;
    }
    printf("--> %d failures out of %d runs.\n",(ulong)uVar2,(ulong)local_8);
    if ((fVar1 != -1.0) || (NAN(fVar1))) {
      dVar3 = round((double)(fVar1 * (float)(int)local_8));
      printf("    expected would be ~%d.\n",(ulong)(uint)(int)dVar3);
    }
    fflush(_stdout);
  }
  return (_Bool)(local_9 & 1);
}

Assistant:

bool test_fprob(int K, int nTest)
{
	bool success = true;

	/* Tests at fixed losses */
	float losses[] = { 0.1, 0.85, 1 };
	float expected_fps[3] = { -1, -1, -1 };
	if (K == 100) {
		/* Graphs in sect B.3.1 of the monograph were used to
		 * read off expected failure probabilities.
		 */
		expected_fps[0] = pow(10, -2.4); // from B.3.1
		expected_fps[1] = pow(10, -2.3); // from B.3.1
	}
	const int nLosses = (int)(sizeof(losses) / sizeof(losses[0]));
	for (int i = 0; i < nLosses; ++i) {
		const float loss = losses[i];
		const float expected_fp = expected_fps[i];
		printf("Running fixed loss tests. K=%d, nTest=%d, "
		  "loss=%g.\n", K, nTest, (double)loss);
		int nfail = zero_overhead_test(K, nTest, loss);
		if (nfail < 0) {
			fprintf(stderr, "Error:  random_esi_test() failed.\n");
			success = false;
		}
		printf("--> %d failures out of %d runs.\n", nfail, nTest);
		if (expected_fp != -1) {
			printf("    expected would be ~%d.\n",
				(int)round(expected_fp * nTest));
		}
		fflush(stdout);
	}

	return success;
}